

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void triangle(array<vec<3UL,_int>,_3UL> pts,vector<double,_std::allocator<double>_> *zbuffer,
             TGAImage *image,TGAColor color)

{
  int iVar1;
  pointer pdVar2;
  vec3i P;
  size_t sVar3;
  size_t sVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  long lVar8;
  double *pdVar9;
  int j;
  size_t i;
  int iVar10;
  double dVar11;
  TGAColor color_local;
  vec2i bboxmax;
  vec2i bboxmin;
  vec2i clamp;
  vec3f bc_screen;
  
  color_local.bgra = color.bgra;
  color_local.bytespp = color.bytespp;
  bboxmin.x = 0x7fffffff;
  bboxmin.y = 0x7fffffff;
  bboxmax.x = -0x80000000;
  bboxmax.y = -0x80000000;
  sVar3 = TGAImage::get_width(image);
  sVar4 = TGAImage::get_height(image);
  clamp.y = (int)sVar4 + -1;
  clamp.x = (int)sVar3 + -1;
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    for (sVar3 = 0; sVar3 != 2; sVar3 = sVar3 + 1) {
      piVar5 = vec<2UL,_int>::operator[](&bboxmin,sVar3);
      piVar6 = vec<3UL,_int>::operator[](pts._M_elems + lVar8,sVar3);
      iVar10 = *piVar5;
      if (*piVar6 < *piVar5) {
        iVar10 = *piVar6;
      }
      if (iVar10 < 1) {
        iVar10 = 0;
      }
      piVar5 = vec<2UL,_int>::operator[](&bboxmin,sVar3);
      *piVar5 = iVar10;
      piVar5 = vec<2UL,_int>::operator[](&clamp,sVar3);
      piVar6 = vec<2UL,_int>::operator[](&bboxmax,sVar3);
      piVar7 = vec<3UL,_int>::operator[](pts._M_elems + lVar8,sVar3);
      iVar10 = *piVar7;
      if (*piVar7 < *piVar6) {
        iVar10 = *piVar6;
      }
      if (*piVar5 <= iVar10) {
        iVar10 = *piVar5;
      }
      piVar5 = vec<2UL,_int>::operator[](&bboxmax,sVar3);
      *piVar5 = iVar10;
    }
  }
  iVar10 = 0;
  for (sVar3 = (size_t)bboxmin.x; (long)sVar3 <= (long)bboxmax.x; sVar3 = sVar3 + 1) {
    for (sVar4 = (size_t)bboxmin.y; (long)sVar4 <= (long)bboxmax.y; sVar4 = sVar4 + 1) {
      P.y = (int)sVar4;
      P.x = (int)sVar3;
      P.z = iVar10;
      barycentric(&bc_screen,pts._M_elems[0],pts._M_elems[1],pts._M_elems[2],P);
      if (((0.0 <= bc_screen.x) && (0.0 <= bc_screen.y)) && (0.0 <= bc_screen.z)) {
        iVar10 = 0;
        piVar5 = &pts._M_elems[0].z;
        for (i = 0; i != 3; i = i + 1) {
          iVar1 = *piVar5;
          pdVar9 = vec<3UL,_double>::operator[](&bc_screen,i);
          iVar10 = iVar10 + (int)*pdVar9 * iVar1;
          piVar5 = piVar5 + 3;
        }
        pdVar2 = (zbuffer->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        dVar11 = (double)iVar10;
        pdVar9 = pdVar2 + sVar4 * 600 + sVar3;
        if (*pdVar9 <= dVar11 && dVar11 != *pdVar9) {
          pdVar2[sVar4 * 600 + sVar3] = dVar11;
          TGAImage::set(image,sVar3,sVar4,&color_local);
        }
      }
    }
  }
  return;
}

Assistant:

void triangle(std::array<vec3i, 3> pts, std::vector<double> &zbuffer, TGAImage &image,
              TGAColor color)
{
    vec2i bboxmin(std::numeric_limits<int>::max(), std::numeric_limits<int>::max());
    vec2i bboxmax(std::numeric_limits<int>::min(), std::numeric_limits<int>::min());
    vec2i clamp(image.get_width() - 1, image.get_height() - 1);
    for (int i = 0; i < 3; i++) {
        for (int j = 0; j < 2; j++) {
            bboxmin[j] = std::max(0, std::min(bboxmin[j], pts[i][j]));
            bboxmax[j] = std::min(clamp[j], std::max(bboxmax[j], pts[i][j]));
        }
    }
    vec3i P;
    for (P.x = bboxmin.x; P.x <= bboxmax.x; P.x++) {
        for (P.y = bboxmin.y; P.y <= bboxmax.y; P.y++) {
            vec3f bc_screen = barycentric(pts[0], pts[1], pts[2], P);
            if (bc_screen.x < 0 || bc_screen.y < 0 || bc_screen.z < 0) continue;
            P.z = 0;
            for (int i = 0; i < 3; i++) P.z += pts[i][2] * static_cast<int>(bc_screen[i]);
            if (zbuffer[int(P.x + P.y * width)] < P.z) {
                zbuffer[int(P.x + P.y * width)] = P.z;
                image.set(static_cast<int>(P.x), static_cast<int>(P.y), color);
            }
        }
    }
}